

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

long duckdb::BitwiseShiftLeftOperator::Operation<long,long,long>(long input,long shift)

{
  OutOfRangeException *pOVar1;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (input < 0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_e0,"Cannot left-shift negative number %s",&local_e1);
    ::std::__cxx11::to_string(&local_40,input);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_40);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (-1 < shift) {
    if ((ulong)shift < 0x40) {
      if (shift != 0) {
        if (0x8000000000000000U >> ((byte)shift & 0x3f) <= (ulong)input) {
          pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_e0,"Overflow in left shift (%s << %s)",&local_e1);
          ::std::__cxx11::to_string(&local_a0,input);
          ::std::__cxx11::to_string(&local_c0,shift);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar1,&local_e0,&local_a0,&local_c0);
          __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        input = input << ((byte)shift & 0x3f);
      }
    }
    else {
      if (input != 0) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"Left-shift value %s is out of range",&local_e1);
        ::std::__cxx11::to_string(&local_80,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_80);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input = 0;
    }
    return input;
  }
  pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_e0,"Cannot left-shift by negative number %s",&local_e1);
  ::std::__cxx11::to_string(&local_60,shift);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e0,&local_60);
  __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}